

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.h
# Opt level: O1

GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
* __thiscall
rapidjson::
GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::Resolve(GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          *__return_storage_ptr__,
         GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
         *this,GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
               *baseuri,CrtAllocator *allocator)

{
  int iVar1;
  size_t sVar2;
  Ch *pCVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  int iVar9;
  
  __return_storage_ptr__->frag_ = (Ch *)0x0;
  __return_storage_ptr__->allocator_ = (CrtAllocator *)0x0;
  __return_storage_ptr__->path_ = (Ch *)0x0;
  __return_storage_ptr__->query_ = (Ch *)0x0;
  __return_storage_ptr__->scheme_ = (Ch *)0x0;
  __return_storage_ptr__->auth_ = (Ch *)0x0;
  __return_storage_ptr__->uri_ = (Ch *)0x0;
  __return_storage_ptr__->base_ = (Ch *)0x0;
  __return_storage_ptr__->ownAllocator_ = (CrtAllocator *)0x0;
  __return_storage_ptr__->allocator_ = allocator;
  if (this->uri_ == (char *)0x0) {
    iVar9 = 1;
  }
  else {
    sVar2 = strlen(this->uri_);
    iVar9 = (int)sVar2 + 1;
  }
  if (baseuri->uri_ == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    sVar2 = strlen(baseuri->uri_);
    iVar1 = (int)sVar2;
  }
  Allocate(__return_storage_ptr__,(ulong)(uint)(iVar9 + iVar1));
  pcVar7 = this->scheme_;
  if ((pcVar7 == (char *)0x0) || (sVar2 = strlen(pcVar7), (int)sVar2 == 0)) {
    pCVar3 = __return_storage_ptr__->scheme_;
    pcVar7 = baseuri->scheme_;
    if (pcVar7 == (char *)0x0) {
      sVar6 = 0;
    }
    else {
      sVar2 = strlen(pcVar7);
      sVar6 = sVar2 & 0xffffffff;
    }
    pCVar3 = CopyPart(this,pCVar3,pcVar7,sVar6);
    __return_storage_ptr__->auth_ = pCVar3;
    pcVar7 = this->auth_;
    if ((pcVar7 == (char *)0x0) || (sVar2 = strlen(pcVar7), (int)sVar2 == 0)) {
      pcVar7 = baseuri->auth_;
      if (pcVar7 == (char *)0x0) {
        sVar6 = 0;
      }
      else {
        sVar2 = strlen(pcVar7);
        sVar6 = sVar2 & 0xffffffff;
      }
      pCVar3 = CopyPart(this,pCVar3,pcVar7,sVar6);
      __return_storage_ptr__->path_ = pCVar3;
      pcVar7 = this->path_;
      if ((pcVar7 == (char *)0x0) || (sVar2 = strlen(pcVar7), (int)sVar2 == 0)) {
        pcVar7 = baseuri->path_;
        if (pcVar7 == (char *)0x0) {
          sVar6 = 0;
        }
        else {
          sVar2 = strlen(pcVar7);
          sVar6 = sVar2 & 0xffffffff;
        }
        pCVar3 = CopyPart(this,pCVar3,pcVar7,sVar6);
        __return_storage_ptr__->query_ = pCVar3;
        pcVar7 = this->query_;
        if ((pcVar7 == (char *)0x0) || (sVar2 = strlen(pcVar7), (int)sVar2 == 0)) {
          pcVar7 = baseuri->query_;
          if (pcVar7 == (char *)0x0) {
            sVar6 = 0;
          }
          else {
            sVar2 = strlen(pcVar7);
            sVar6 = sVar2 & 0xffffffff;
          }
        }
        else if (pcVar7 == (char *)0x0) {
          sVar6 = 0;
        }
        else {
          sVar2 = strlen(pcVar7);
          sVar6 = sVar2 & 0xffffffff;
        }
      }
      else {
        if (*pcVar7 == '/') {
          if (pCVar3 == (Ch *)0x0) {
            __assert_fail("to != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/uri.h"
                          ,400,
                          "Ch *rapidjson::GenericUri<rapidjson::GenericValue<rapidjson::UTF8<>>>::CopyPart(Ch *, Ch *, std::size_t) [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                         );
          }
          sVar2 = strlen(pcVar7);
          uVar5 = sVar2 & 0xffffffff;
          memcpy(pCVar3,pcVar7,uVar5);
          pCVar3[uVar5] = '\0';
          __return_storage_ptr__->query_ = pCVar3 + uVar5 + 1;
          RemoveDotSegments(__return_storage_ptr__);
        }
        else {
          if (((baseuri->auth_ == (char *)0x0) || (sVar2 = strlen(baseuri->auth_), (int)sVar2 == 0))
             || ((baseuri->path_ != (char *)0x0 && (sVar2 = strlen(baseuri->path_), (int)sVar2 != 0)
                 ))) {
            lVar8 = 0;
          }
          else {
            *pCVar3 = '/';
            lVar8 = 1;
          }
          pcVar7 = baseuri->path_;
          if (pcVar7 == (char *)0x0) {
            sVar2 = 0;
          }
          else {
            sVar2 = strlen(pcVar7);
            sVar2 = sVar2 & 0xffffffff;
          }
          if (sVar2 != 0) {
            do {
              if (pcVar7[sVar2 - 1] == '/') goto LAB_001215ec;
              sVar2 = sVar2 - 1;
            } while (sVar2 != 0);
            sVar2 = 0;
          }
LAB_001215ec:
          memcpy(__return_storage_ptr__->path_ + lVar8,pcVar7,sVar2);
          pCVar3 = __return_storage_ptr__->path_;
          pcVar7 = this->path_;
          if (pcVar7 == (char *)0x0) {
            sVar6 = 0;
          }
          else {
            sVar4 = strlen(pcVar7);
            sVar6 = sVar4 & 0xffffffff;
          }
          pCVar3 = CopyPart(this,pCVar3 + sVar2 + lVar8,pcVar7,sVar6);
          __return_storage_ptr__->query_ = pCVar3;
          RemoveDotSegments(__return_storage_ptr__);
        }
        pCVar3 = __return_storage_ptr__->query_;
        pcVar7 = this->query_;
        if (pcVar7 == (char *)0x0) {
          sVar6 = 0;
        }
        else {
          sVar2 = strlen(pcVar7);
          sVar6 = sVar2 & 0xffffffff;
        }
      }
      pCVar3 = CopyPart(this,pCVar3,pcVar7,sVar6);
      __return_storage_ptr__->frag_ = pCVar3;
      goto LAB_00121666;
    }
    if (pcVar7 == (char *)0x0) {
      sVar6 = 0;
    }
    else {
      sVar2 = strlen(pcVar7);
      sVar6 = sVar2 & 0xffffffff;
    }
  }
  else {
    pCVar3 = __return_storage_ptr__->scheme_;
    if (pcVar7 == (char *)0x0) {
      sVar6 = 0;
    }
    else {
      sVar2 = strlen(pcVar7);
      sVar6 = sVar2 & 0xffffffff;
    }
    pCVar3 = CopyPart(this,pCVar3,pcVar7,sVar6);
    __return_storage_ptr__->auth_ = pCVar3;
    pcVar7 = this->auth_;
    if (pcVar7 == (char *)0x0) {
      sVar6 = 0;
    }
    else {
      sVar2 = strlen(pcVar7);
      sVar6 = sVar2 & 0xffffffff;
    }
  }
  pCVar3 = CopyPart(this,pCVar3,pcVar7,sVar6);
  __return_storage_ptr__->path_ = pCVar3;
  pcVar7 = this->path_;
  if (pcVar7 == (char *)0x0) {
    sVar6 = 0;
  }
  else {
    sVar2 = strlen(pcVar7);
    sVar6 = sVar2 & 0xffffffff;
  }
  pCVar3 = CopyPart(this,pCVar3,pcVar7,sVar6);
  __return_storage_ptr__->query_ = pCVar3;
  pcVar7 = this->query_;
  if (pcVar7 == (char *)0x0) {
    sVar6 = 0;
  }
  else {
    sVar2 = strlen(pcVar7);
    sVar6 = sVar2 & 0xffffffff;
  }
  pCVar3 = CopyPart(this,pCVar3,pcVar7,sVar6);
  __return_storage_ptr__->frag_ = pCVar3;
  RemoveDotSegments(__return_storage_ptr__);
LAB_00121666:
  pCVar3 = __return_storage_ptr__->frag_;
  pcVar7 = this->frag_;
  if (pcVar7 == (char *)0x0) {
    sVar6 = 0;
  }
  else {
    sVar2 = strlen(pcVar7);
    sVar6 = sVar2 & 0xffffffff;
  }
  pCVar3 = CopyPart(this,pCVar3,pcVar7,sVar6);
  __return_storage_ptr__->base_ = pCVar3;
  SetBase(__return_storage_ptr__);
  pcVar7 = __return_storage_ptr__->base_;
  if (pcVar7 == (char *)0x0) {
    uVar5 = 0;
  }
  else {
    sVar2 = strlen(pcVar7);
    uVar5 = sVar2 & 0xffffffff;
  }
  __return_storage_ptr__->uri_ = pcVar7 + uVar5 + 1;
  SetUri(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

GenericUri Resolve(const GenericUri& baseuri, Allocator* allocator = 0) {
        GenericUri resuri;
        resuri.allocator_ = allocator;
        // Ensure enough space for combining paths
        resuri.Allocate(GetStringLength() + baseuri.GetStringLength() + 1); // + 1 for joining slash

        if (!(GetSchemeStringLength() == 0)) {
            // Use all of this URI
            resuri.auth_ = CopyPart(resuri.scheme_, scheme_, GetSchemeStringLength());
            resuri.path_ = CopyPart(resuri.auth_, auth_, GetAuthStringLength());
            resuri.query_ = CopyPart(resuri.path_, path_, GetPathStringLength());
            resuri.frag_ = CopyPart(resuri.query_, query_, GetQueryStringLength());
            resuri.RemoveDotSegments();
        } else {
            // Use the base scheme
            resuri.auth_ = CopyPart(resuri.scheme_, baseuri.scheme_, baseuri.GetSchemeStringLength());
            if (!(GetAuthStringLength() == 0)) {
                // Use this auth, path, query
                resuri.path_ = CopyPart(resuri.auth_, auth_, GetAuthStringLength());
                resuri.query_ = CopyPart(resuri.path_, path_, GetPathStringLength());
                resuri.frag_ = CopyPart(resuri.query_, query_, GetQueryStringLength());
                resuri.RemoveDotSegments();
            } else {
                // Use the base auth
                resuri.path_ = CopyPart(resuri.auth_, baseuri.auth_, baseuri.GetAuthStringLength());
                if (GetPathStringLength() == 0) {
                    // Use the base path
                    resuri.query_ = CopyPart(resuri.path_, baseuri.path_, baseuri.GetPathStringLength());
                    if (GetQueryStringLength() == 0) {
                        // Use the base query
                        resuri.frag_ = CopyPart(resuri.query_, baseuri.query_, baseuri.GetQueryStringLength());
                    } else {
                        // Use this query
                        resuri.frag_ = CopyPart(resuri.query_, query_, GetQueryStringLength());
                    }
                } else {
                    if (path_[0] == '/') {
                        // Absolute path - use all of this path
                        resuri.query_ = CopyPart(resuri.path_, path_, GetPathStringLength());
                        resuri.RemoveDotSegments();
                    } else {
                        // Relative path - append this path to base path after base path's last slash
                        size_t pos = 0;
                        if (!(baseuri.GetAuthStringLength() == 0) && baseuri.GetPathStringLength() == 0) {
                            resuri.path_[pos] = '/';
                            pos++;
                        }
                        size_t lastslashpos = baseuri.GetPathStringLength();
                        while (lastslashpos > 0) {
                            if (baseuri.path_[lastslashpos - 1] == '/') break;
                            lastslashpos--;
                        }
                        std::memcpy(&resuri.path_[pos], baseuri.path_, lastslashpos * sizeof(Ch));
                        pos += lastslashpos;
                        resuri.query_ = CopyPart(&resuri.path_[pos], path_, GetPathStringLength());
                        resuri.RemoveDotSegments();
                    }
                    // Use this query
                    resuri.frag_ = CopyPart(resuri.query_, query_, GetQueryStringLength());
                }
            }
        }
        // Always use this frag
        resuri.base_ = CopyPart(resuri.frag_, frag_, GetFragStringLength());

        // Re-constitute base_ and uri_
        resuri.SetBase();
        resuri.uri_ = resuri.base_ + resuri.GetBaseStringLength() + 1;
        resuri.SetUri();
        return resuri;
    }